

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  ZSTD_matchState_t *pZVar1;
  seqDef *psVar2;
  bool bVar3;
  seqStore_t *psVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  ulong uVar12;
  int *ip_00;
  BYTE *ip;
  int *piVar13;
  U32 UVar14;
  int iVar15;
  U32 UVar16;
  int *piVar17;
  U32 UVar18;
  U32 UVar19;
  long lVar20;
  int iVar21;
  size_t offset2;
  int *local_e0;
  size_t local_d8;
  size_t local_c8;
  BYTE *local_c0;
  BYTE *local_b8;
  ulong local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  int *local_98;
  uint local_8c;
  BYTE *local_88;
  ZSTD_matchState_t *local_80;
  U32 *local_78;
  BYTE *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  seqStore_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pBVar9 = (ms->window).base;
  uVar5 = (ms->window).dictLimit;
  uVar12 = (ulong)uVar5;
  local_c0 = pBVar9 + uVar12;
  UVar19 = *rep;
  UVar16 = rep[1];
  pZVar1 = ms->dictMatchState;
  local_a0 = (pZVar1->window).nextSrc;
  local_88 = (pZVar1->window).base;
  local_70 = local_88 + (pZVar1->window).dictLimit;
  iVar15 = (int)local_a0;
  ms->nextToUpdate3 = ms->nextToUpdate;
  iEnd = (BYTE *)((long)src + srcSize);
  local_98 = (int *)((long)src + (srcSize - 8));
  piVar17 = (int *)((ulong)(((int)src - (int)local_c0) + iVar15 == (int)local_70) + (long)src);
  local_78 = rep;
  if (piVar17 < local_98) {
    local_8c = ((int)local_88 - iVar15) + uVar5;
    local_a8 = local_88 + -(ulong)local_8c;
    iVar21 = (int)pBVar9;
    local_58 = (ulong)((1 - uVar5) - iVar21);
    local_60 = (ulong)(uint)-iVar21;
    local_68 = (ulong)((((iVar15 - uVar5) - (int)local_88) - iVar21) + 1);
    local_b8 = pBVar9;
    local_b0 = uVar12;
    local_80 = ms;
    local_50 = seqStore;
    do {
      iVar15 = (int)piVar17;
      uVar5 = ((iVar15 - (int)pBVar9) - UVar19) + 1;
      uVar8 = (uint)uVar12;
      piVar13 = (int *)(pBVar9 + uVar5);
      if (uVar5 < uVar8) {
        piVar13 = (int *)(local_88 + (uVar5 - local_8c));
      }
      if ((uVar5 - uVar8 < 0xfffffffd) && (*piVar13 == *(int *)((long)piVar17 + 1))) {
        pBVar9 = iEnd;
        if (uVar5 < uVar8) {
          pBVar9 = local_a0;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar17 + 5),(BYTE *)(piVar13 + 1),iEnd,pBVar9,local_c0);
        uVar12 = sVar6 + 4;
      }
      else {
        uVar12 = 0;
      }
      local_c8 = 999999999;
      sVar7 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS(local_80,(BYTE *)piVar17,iEnd,&local_c8)
      ;
      sVar6 = uVar12;
      if (uVar12 < sVar7) {
        sVar6 = sVar7;
      }
      if (sVar6 < 4) {
        piVar17 = (int *)((long)piVar17 + ((long)piVar17 - (long)src >> 8) + 1);
        uVar12 = local_b0;
        pBVar9 = local_b8;
      }
      else {
        local_e0 = piVar17;
        local_d8 = local_c8;
        if (sVar7 <= uVar12) {
          local_d8 = 0;
          local_e0 = (int *)((long)piVar17 + 1);
        }
        local_38 = (ulong)(((int)local_58 + iVar15) - UVar19);
        local_40 = (ulong)(((int)local_60 + iVar15) - UVar19);
        local_48 = (ulong)(((int)local_68 + iVar15) - UVar19);
        lVar20 = 0;
        do {
          if (local_98 <= (int *)((long)piVar17 + lVar20)) break;
          ip_00 = (int *)((long)piVar17 + lVar20 + 1);
          iVar15 = (int)lVar20;
          uVar5 = (int)local_40 + iVar15 + 1;
          piVar13 = (int *)(local_b8 + uVar5);
          if (uVar5 < (uint)local_b0) {
            piVar13 = (int *)(local_88 + (uint)((int)local_48 + iVar15));
          }
          if (((uint)((int)local_38 + iVar15) < 0xfffffffd) && (*piVar13 == *ip_00)) {
            pBVar9 = iEnd;
            if (uVar5 < (uint)local_b0) {
              pBVar9 = local_a0;
            }
            sVar7 = ZSTD_count_2segments
                              ((BYTE *)((long)piVar17 + lVar20 + 5),(BYTE *)(piVar13 + 1),iEnd,
                               pBVar9,local_c0);
            if (sVar7 < 0xfffffffffffffffc) {
              uVar8 = (int)local_d8 + 1;
              uVar5 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
                local_d8 = 0;
                sVar6 = sVar7 + 4;
                local_e0 = ip_00;
              }
            }
          }
          local_c8 = 999999999;
          sVar7 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                            (local_80,(BYTE *)ip_00,iEnd,&local_c8);
          bVar3 = true;
          if (3 < sVar7) {
            uVar8 = (int)local_d8 + 1;
            uVar5 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar8 = (int)local_c8 + 1;
            iVar15 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x1b) < (int)sVar7 * 4 - iVar15) {
              bVar3 = false;
              local_d8 = local_c8;
              sVar6 = sVar7;
              local_e0 = ip_00;
            }
          }
          lVar20 = lVar20 + 1;
        } while (!bVar3);
        psVar4 = local_50;
        pBVar9 = local_b8;
        if (local_d8 == 0) {
          UVar14 = 1;
          UVar18 = UVar19;
        }
        else {
          uVar12 = (long)local_e0 + (-0xfffffffe - (long)(local_b8 + local_d8));
          pBVar10 = local_b8;
          pBVar11 = local_c0;
          if ((uint)uVar12 < (uint)local_b0) {
            pBVar10 = local_a8;
            pBVar11 = local_70;
          }
          if ((src < local_e0) && (uVar12 = uVar12 & 0xffffffff, pBVar11 < pBVar10 + uVar12)) {
            pBVar10 = pBVar10 + uVar12;
            do {
              piVar17 = (int *)((long)local_e0 + -1);
              pBVar10 = pBVar10 + -1;
              if ((*(BYTE *)piVar17 != *pBVar10) ||
                 (sVar6 = sVar6 + 1, local_e0 = piVar17, piVar17 <= src)) break;
            } while (pBVar11 < pBVar10);
          }
          UVar14 = (int)local_d8 + 1;
          UVar18 = (int)local_d8 - 2;
          UVar16 = UVar19;
        }
        uVar12 = (long)local_e0 - (long)src;
        pBVar10 = local_50->lit;
        pBVar11 = pBVar10 + uVar12;
        do {
          *(undefined8 *)pBVar10 = *src;
          pBVar10 = pBVar10 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar10 < pBVar11);
        local_50->lit = local_50->lit + uVar12;
        if (0xffff < uVar12) {
          local_50->longLengthID = 1;
          local_50->longLengthPos =
               (U32)((ulong)((long)local_50->sequences - (long)local_50->sequencesStart) >> 3);
        }
        psVar2 = local_50->sequences;
        psVar2->litLength = (U16)uVar12;
        psVar2->offset = UVar14;
        if (0xffff < sVar6 - 3) {
          local_50->longLengthID = 2;
          local_50->longLengthPos =
               (U32)((ulong)((long)psVar2 - (long)local_50->sequencesStart) >> 3);
        }
        psVar2->matchLength = (U16)(sVar6 - 3);
        local_50->sequences = psVar2 + 1;
        src = (void *)((long)local_e0 + sVar6);
        pBVar11 = local_a8;
        uVar12 = local_b0;
        piVar17 = (int *)src;
        do {
          UVar19 = UVar18;
          if (local_98 < piVar17) break;
          uVar5 = ((int)piVar17 - (int)pBVar9) - UVar16;
          uVar8 = (uint)uVar12;
          pBVar10 = pBVar9;
          if (uVar5 < uVar8) {
            pBVar10 = pBVar11;
          }
          if ((uVar5 - uVar8 < 0xfffffffd) && (*(int *)(pBVar10 + uVar5) == *piVar17)) {
            pBVar11 = iEnd;
            if (uVar5 < uVar8) {
              pBVar11 = local_a0;
            }
            sVar6 = ZSTD_count_2segments
                              ((BYTE *)(piVar17 + 1),(BYTE *)((long)(pBVar10 + uVar5) + 4),iEnd,
                               pBVar11,local_c0);
            *(undefined8 *)psVar4->lit = *src;
            psVar2 = psVar4->sequences;
            psVar2->litLength = 0;
            psVar2->offset = 1;
            if (0xffff < sVar6 + 1) {
              psVar4->longLengthID = 2;
              psVar4->longLengthPos =
                   (U32)((ulong)((long)psVar2 - (long)psVar4->sequencesStart) >> 3);
            }
            psVar2->matchLength = (U16)(sVar6 + 1);
            psVar4->sequences = psVar2 + 1;
            src = (void *)((long)piVar17 + sVar6 + 4);
            bVar3 = true;
            pBVar11 = local_a8;
            uVar12 = local_b0;
            piVar17 = (int *)src;
            UVar18 = UVar16;
          }
          else {
            bVar3 = false;
            UVar19 = UVar16;
          }
          UVar16 = UVar19;
          UVar19 = UVar18;
        } while (bVar3);
      }
    } while (piVar17 < local_98);
  }
  *local_78 = UVar19;
  local_78[1] = UVar16;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 1, ZSTD_dictMatchState);
}